

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool addkeyword(int type,char *name)

{
  ident local_58;
  char *local_18;
  char *name_local;
  int type_local;
  
  local_18 = name;
  name_local._4_4_ = type;
  ident::ident(&local_58,type,name,"",0,(void *)0x0,0);
  addident(&local_58);
  return true;
}

Assistant:

bool addkeyword(int type, const char *name)
{
    addident(ident(type, name, "", 0, NULL));
    return true;
}